

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O0

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createMemSet(LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  function_ref<void_(const_llvm::Value_*)> Func;
  bool bVar1;
  PSNode *n;
  PointerGraph *in_RSI;
  PSNodesSeq *in_RDI;
  PSNode *S;
  PSNode *G;
  PSNode *op;
  PSNode *val;
  PSNodesSeq *ret;
  undefined8 in_stack_ffffffffffffff88;
  uint i;
  PSNodesSeq *this_00;
  anon_class_1_0_00000001 local_39;
  function_ref<void(llvm::Value_const*)> local_38 [16];
  PSNode *local_28;
  undefined8 local_20;
  
  i = (uint)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  this_00 = in_RDI;
  llvm::cast<llvm::IntrinsicInst,llvm::Instruction_const>((Instruction *)0x1bb1b4);
  bVar1 = llvmutils::memsetIsZeroInitialization((IntrinsicInst *)0x1bb1bc);
  if (bVar1) {
    local_20 = NULLPTR;
  }
  else {
    local_20 = UNKNOWN_MEMORY;
  }
  n = (PSNode *)llvm::User::getOperand((User *)in_RDI,i);
  llvm::function_ref<void(llvm::Value_const*)>::
  function_ref<llvm::Value::stripInBoundsOffsets(llvm::function_ref<void(llvm::Value_const*)>)::_default_arg_1_::_lambda(llvm::Value_const*)_1_>
            (local_38,&local_39,
             (enable_if_t<_std::is_same<remove_cvref_t<(lambda_at__usr_lib_llvm_14_include_llvm_IR_Value_h:745:35)>,_function_ref<void_(const_Value_*)>_>::value>
              *)0x0,(enable_if_t<std::is_void<void>::value____std::is_convertible<decltype(std::declval<(lambda_at__usr_lib_llvm_14_include_llvm_IR_Value_h:745:35)>()(std::declval<const_Value_*>())),_void>::value>
                     *)0x0);
  Func.callable = (intptr_t)in_RSI;
  Func.callback = (_func_void_intptr_t_Value_ptr *)this_00;
  llvm::Value::stripInBoundsOffsets((Value *)in_RDI,Func);
  local_28 = getOperand((LLVMPointerGraphBuilder *)this_00,(Value *)in_RDI);
  PointerGraph::create<(dg::pta::PSNodeType)4,dg::pta::PSNode*&,unsigned_long_const&>
            (in_RSI,(PSNode **)this_00,(unsigned_long *)in_RDI);
  PointerGraph::create<(dg::pta::PSNodeType)3,dg::pta::PSNode*&,dg::pta::PSNode*&>
            (in_RSI,(PSNode **)this_00,(PSNode **)in_RDI);
  PSNodesSeq::PSNodesSeq(in_RDI,n);
  PSNodesSeq::append(in_RDI,n);
  return this_00;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq
LLVMPointerGraphBuilder::createMemSet(const llvm::Instruction *Inst) {
    PSNode *val;
    if (llvmutils::memsetIsZeroInitialization(
                llvm::cast<llvm::IntrinsicInst>(Inst)))
        val = NULLPTR;
    else
        // if the memset is not 0-initialized, it does some
        // garbage into the pointer
        val = UNKNOWN_MEMORY;

    PSNode *op = getOperand(Inst->getOperand(0)->stripInBoundsOffsets());
    // we need to make unknown offsets
    PSNode *G = PS.create<PSNodeType::GEP>(op, Offset::UNKNOWN);
    PSNode *S = PS.create<PSNodeType::STORE>(val, G);

    PSNodesSeq ret(G);
    ret.append(S);
    // no representant here...

    return ret;
}